

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

void StoreHuffmanTreeToBitMask
               (VP8LBitWriter *bw,HuffmanTreeToken *tokens,int num_tokens,
               HuffmanTreeCode *huffman_code)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int in_EDX;
  long in_RSI;
  int extra_bits;
  int ix;
  int i;
  int in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  undefined4 local_24;
  
  for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
    uVar2 = (uint)*(byte *)(in_RSI + (long)local_24 * 2);
    bVar1 = *(byte *)(in_RSI + 1 + (long)local_24 * 2);
    uVar3 = (uint)bVar1;
    VP8LPutBits((VP8LBitWriter *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffd0),
                in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    if (uVar2 == 0x10) {
      VP8LPutBits((VP8LBitWriter *)CONCAT44(uVar3,0x10),in_stack_ffffffffffffffcc,
                  in_stack_ffffffffffffffc8);
    }
    else if (uVar2 == 0x11) {
      VP8LPutBits((VP8LBitWriter *)CONCAT44(uVar3,0x11),in_stack_ffffffffffffffcc,
                  in_stack_ffffffffffffffc8);
    }
    else if (uVar2 == 0x12) {
      VP8LPutBits((VP8LBitWriter *)CONCAT44(uVar3,0x12),in_stack_ffffffffffffffcc,
                  in_stack_ffffffffffffffc8);
    }
    in_stack_ffffffffffffffd0 = uVar2;
  }
  return;
}

Assistant:

static void StoreHuffmanTreeToBitMask(
    VP8LBitWriter* const bw,
    const HuffmanTreeToken* const tokens, const int num_tokens,
    const HuffmanTreeCode* const huffman_code) {
  int i;
  for (i = 0; i < num_tokens; ++i) {
    const int ix = tokens[i].code;
    const int extra_bits = tokens[i].extra_bits;
    VP8LPutBits(bw, huffman_code->codes[ix], huffman_code->code_lengths[ix]);
    switch (ix) {
      case 16:
        VP8LPutBits(bw, extra_bits, 2);
        break;
      case 17:
        VP8LPutBits(bw, extra_bits, 3);
        break;
      case 18:
        VP8LPutBits(bw, extra_bits, 7);
        break;
    }
  }
}